

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t loader::zeModuleDestroy(ze_module_handle_t hModule)

{
  _ze_module_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hModule + 8) + 0x500) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_module_handle_t **)hModule;
    zVar1 = (**(code **)(*(long *)(hModule + 8) + 0x500))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_module_handle_t_*>,__ze_module_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_module_handle_t_*>,__ze_module_handle_t_*> *)
                 (context + 0x540),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleDestroy(
        ze_module_handle_t hModule                      ///< [in][release] handle of the module
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( hModule )->dditable;
        auto pfnDestroy = dditable->ze.Module.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModule = reinterpret_cast<ze_module_object_t*>( hModule )->handle;

        // forward to device-driver
        result = pfnDestroy( hModule );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_module_factory.release( hModule );

        return result;
    }